

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bstrListAlloc(bstrList *sl,int msz)

{
  uint uVar1;
  bstring *pptVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = -1;
  if ((((0 < msz && sl != (bstrList *)0x0) && (sl->entry != (bstring *)0x0)) && (-1 < sl->qty)) &&
     (uVar1 = sl->mlen, sl->qty <= (int)uVar1 && 0 < (int)uVar1)) {
    if (uVar1 < (uint)msz) {
      uVar4 = 8;
      if ((7 < (uint)msz) &&
         (uVar1 = (uint)msz >> 1 | msz, uVar1 = uVar1 >> 2 | uVar1, uVar1 = uVar1 >> 4 | uVar1,
         uVar1 = uVar1 >> 8 | uVar1, uVar1 = (uVar1 >> 0x10 | uVar1) + 1, uVar4 = (ulong)uVar1,
         (int)uVar1 <= msz)) {
        uVar4 = (ulong)(uint)msz;
      }
      if (uVar4 * 8 < uVar4) {
        return -1;
      }
      pptVar2 = (bstring *)realloc(sl->entry,uVar4 * 8);
      iVar3 = (int)uVar4;
      if ((pptVar2 == (bstring *)0x0) &&
         (pptVar2 = (bstring *)realloc(sl->entry,(ulong)(uint)msz << 3), iVar3 = msz,
         pptVar2 == (bstring *)0x0)) {
        return -1;
      }
      sl->mlen = iVar3;
      sl->entry = pptVar2;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int bstrListAlloc (struct bstrList * sl, int msz) {
bstring * l;
int smsz;
size_t nsz;
	if (!sl || msz <= 0 || !sl->entry || sl->qty < 0 || sl->mlen <= 0 ||
	    sl->qty > sl->mlen) return BSTR_ERR;
	if (sl->mlen >= msz) return BSTR_OK;
	smsz = snapUpSize (msz);
	nsz = ((size_t) smsz) * sizeof (bstring);
	if (nsz < (size_t) smsz) return BSTR_ERR;
	l = (bstring *) bstr__realloc (sl->entry, nsz);
	if (!l) {
		smsz = msz;
		nsz = ((size_t) smsz) * sizeof (bstring);
		l = (bstring *) bstr__realloc (sl->entry, nsz);
		if (!l) return BSTR_ERR;
	}
	sl->mlen = smsz;
	sl->entry = l;
	return BSTR_OK;
}